

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  U32 UVar4;
  
  if (optPtr->literalCompressionMode != ZSTD_lcm_uncompressed) {
    uVar3 = optPtr->litSum + 1;
    if (optLevel == 0) {
      if (uVar3 == 0) goto LAB_0016f970;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      UVar4 = iVar2 << 8;
    }
    else {
      if (uVar3 == 0) goto LAB_0016f970;
      uVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (0x16 < uVar1) goto LAB_0016f98f;
      UVar4 = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
    }
    optPtr->litSumBasePrice = UVar4;
  }
  uVar3 = optPtr->litLengthSum + 1;
  if (optLevel == 0) {
    if (uVar3 == 0) goto LAB_0016f970;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    UVar4 = iVar2 << 8;
  }
  else {
    if (uVar3 == 0) goto LAB_0016f970;
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (0x16 < uVar1) goto LAB_0016f98f;
    UVar4 = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  uVar3 = optPtr->matchLengthSum + 1;
  optPtr->litLengthSumBasePrice = UVar4;
  if (optLevel == 0) {
    if (uVar3 == 0) goto LAB_0016f970;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    UVar4 = iVar2 << 8;
  }
  else {
    if (uVar3 == 0) goto LAB_0016f970;
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (0x16 < uVar1) goto LAB_0016f98f;
    UVar4 = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  uVar3 = optPtr->offCodeSum + 1;
  optPtr->matchLengthSumBasePrice = UVar4;
  if (optLevel == 0) {
    if (uVar3 == 0) goto LAB_0016f970;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    UVar4 = iVar2 << 8;
  }
  else {
    if (uVar3 == 0) {
LAB_0016f970:
      __assert_fail("val != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x12c2,"U32 ZSTD_highbit32(U32)");
    }
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (0x16 < uVar1) {
LAB_0016f98f:
      __assert_fail("hb + BITCOST_ACCURACY < 31",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x45cb,"U32 ZSTD_fracWeight(U32)");
    }
    UVar4 = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  optPtr->offCodeSumBasePrice = UVar4;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}